

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_odd_multiples_table_storage_var
               (int n,secp256k1_ge_storage *pre,secp256k1_gej *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  ulong uVar528;
  ulong uVar529;
  ulong uVar530;
  ulong uVar531;
  ulong uVar532;
  ulong uVar533;
  secp256k1_ge_storage *a_00;
  undefined4 in_register_0000003c;
  long lVar534;
  ulong uVar535;
  ulong uVar536;
  ulong uVar537;
  ulong uVar538;
  ulong uVar539;
  ulong uVar540;
  ulong uVar541;
  ulong uVar542;
  ulong uVar543;
  ulong uVar544;
  ulong uVar545;
  ulong uVar546;
  long lVar547;
  uint64_t tmp3_1;
  uint64_t tmp3_3;
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_fe dx_over_dz_squared;
  secp256k1_fe zr;
  secp256k1_fe zi;
  secp256k1_gej pj;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_ge local_268;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  long local_1e8;
  secp256k1_fe local_1d8;
  secp256k1_fe local_1b0;
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  lVar534 = CONCAT44(in_register_0000003c,n);
  if ((int)pre[1].y.n[3] == 0) {
    secp256k1_gej_double(&local_108,(secp256k1_gej *)pre);
  }
  else {
    local_108.infinity = 1;
  }
  local_88.x.n[4] = local_108.x.n[4];
  local_88.x.n[2] = local_108.x.n[2];
  local_88.x.n[3] = local_108.x.n[3];
  local_88.x.n[0] = local_108.x.n[0];
  local_88.x.n[1] = local_108.x.n[1];
  local_88.y.n[0] = local_108.y.n[0];
  local_88.y.n[1] = local_108.y.n[1];
  local_88.y.n[2] = local_108.y.n[2];
  local_88.y.n[3] = local_108.y.n[3];
  local_88.y.n[4] = local_108.y.n[4];
  local_88.infinity = 0;
  secp256k1_ge_set_gej_zinv(&local_268,(secp256k1_gej *)pre,&local_108.z);
  local_188.x.n[4] = local_268.x.n[4];
  local_188.x.n[2] = local_268.x.n[2];
  local_188.x.n[3] = local_268.x.n[3];
  local_188.x.n[0] = local_268.x.n[0];
  local_188.x.n[1] = local_268.x.n[1];
  local_188.y.n[0] = local_268.y.n[0];
  local_188.y.n[1] = local_268.y.n[1];
  local_188.y.n[2] = local_268.y.n[2];
  local_188.y.n[3] = local_268.y.n[3];
  local_188.y.n[4] = local_268.y.n[4];
  local_188.z.n[0] = pre[1].x.n[2];
  local_188.z.n[1] = pre[1].x.n[3];
  local_188.z.n[2] = pre[1].y.n[0];
  local_188.z.n[3] = pre[1].y.n[1];
  local_188.z.n[4] = pre[1].y.n[2];
  local_188.infinity = 0;
  lVar547 = 0x38;
  do {
    secp256k1_fe_normalize_var(&local_188.y);
    *(uint64_t *)(lVar534 + -0x18 + lVar547) = local_188.y.n[1] << 0x34 | local_188.y.n[0];
    *(uint64_t *)(lVar534 + -0x10 + lVar547) = local_188.y.n[2] << 0x28 | local_188.y.n[1] >> 0xc;
    *(uint64_t *)(lVar534 + -8 + lVar547) = local_188.y.n[3] << 0x1c | local_188.y.n[2] >> 0x18;
    *(uint64_t *)(lVar534 + lVar547) = local_188.y.n[4] << 0x10 | local_188.y.n[3] >> 0x24;
    secp256k1_gej_add_ge_var(&local_188,&local_188,&local_88,&local_1d8);
    secp256k1_fe_normalize_var(&local_1d8);
    *(uint64_t *)(lVar534 + -0x38 + lVar547) = local_1d8.n[1] << 0x34 | local_1d8.n[0];
    *(uint64_t *)(lVar534 + -0x30 + lVar547) = local_1d8.n[2] << 0x28 | local_1d8.n[1] >> 0xc;
    *(uint64_t *)(lVar534 + -0x28 + lVar547) = local_1d8.n[3] << 0x1c | local_1d8.n[2] >> 0x18;
    *(uint64_t *)(lVar534 + -0x20 + lVar547) = local_1d8.n[4] << 0x10 | local_1d8.n[3] >> 0x24;
    lVar547 = lVar547 + 0x40;
  } while (lVar547 != 0x7fff8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_108.z.n[0];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = local_188.z.n[3];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_108.z.n[1];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = local_188.z.n[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_108.z.n[2];
  auVar253._8_8_ = 0;
  auVar253._0_8_ = local_188.z.n[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_108.z.n[3];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = local_188.z.n[0];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_108.z.n[4];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = local_188.z.n[4];
  uVar528 = SUB168(auVar5 * auVar255,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar528 & 0xfffffffffffff;
  auVar1 = auVar2 * auVar252 + auVar1 * auVar251 + auVar3 * auVar253 + auVar4 * auVar254 +
           auVar6 * ZEXT816(0x1000003d10);
  uVar529 = auVar1._0_8_;
  local_208 = uVar529 & 0xfffffffffffff;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar529 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_108.z.n[0];
  auVar256._8_8_ = 0;
  auVar256._0_8_ = local_188.z.n[4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_108.z.n[1];
  auVar257._8_8_ = 0;
  auVar257._0_8_ = local_188.z.n[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_108.z.n[2];
  auVar258._8_8_ = 0;
  auVar258._0_8_ = local_188.z.n[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_108.z.n[3];
  auVar259._8_8_ = 0;
  auVar259._0_8_ = local_188.z.n[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_108.z.n[4];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = local_188.z.n[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar528 >> 0x34 | SUB168(auVar5 * auVar255,8) << 0xc;
  auVar1 = auVar7 * auVar256 + auVar465 + auVar8 * auVar257 + auVar9 * auVar258 + auVar10 * auVar259
           + auVar11 * auVar260 + auVar12 * ZEXT816(0x1000003d10);
  uVar528 = auVar1._0_8_;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_108.z.n[0];
  auVar261._8_8_ = 0;
  auVar261._0_8_ = local_188.z.n[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_108.z.n[1];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = local_188.z.n[4];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_108.z.n[2];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = local_188.z.n[3];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_108.z.n[3];
  auVar264._8_8_ = 0;
  auVar264._0_8_ = local_188.z.n[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_108.z.n[4];
  auVar265._8_8_ = 0;
  auVar265._0_8_ = local_188.z.n[1];
  auVar1 = auVar14 * auVar262 + auVar466 + auVar15 * auVar263 + auVar16 * auVar264 +
           auVar17 * auVar265;
  uVar529 = auVar1._0_8_;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar529 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = (uVar529 & 0xfffffffffffff) << 4 | (uVar528 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar13 * auVar261 + ZEXT816(0x1000003d1) * auVar266;
  uVar529 = auVar1._0_8_;
  local_1b0.n[0] = uVar529 & 0xfffffffffffff;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar529 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_108.z.n[0];
  auVar267._8_8_ = 0;
  auVar267._0_8_ = local_188.z.n[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_108.z.n[1];
  auVar268._8_8_ = 0;
  auVar268._0_8_ = local_188.z.n[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_108.z.n[2];
  auVar269._8_8_ = 0;
  auVar269._0_8_ = local_188.z.n[4];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_108.z.n[3];
  auVar270._8_8_ = 0;
  auVar270._0_8_ = local_188.z.n[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_108.z.n[4];
  auVar271._8_8_ = 0;
  auVar271._0_8_ = local_188.z.n[2];
  auVar2 = auVar20 * auVar269 + auVar468 + auVar21 * auVar270 + auVar22 * auVar271;
  uVar529 = auVar2._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar529 & 0xfffffffffffff;
  auVar1 = auVar18 * auVar267 + auVar467 + auVar19 * auVar268 + auVar23 * ZEXT816(0x1000003d10);
  uVar535 = auVar1._0_8_;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar529 >> 0x34 | auVar2._8_8_ << 0xc;
  local_1b0.n[1] = uVar535 & 0xfffffffffffff;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar535 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_108.z.n[0];
  auVar272._8_8_ = 0;
  auVar272._0_8_ = local_188.z.n[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_108.z.n[1];
  auVar273._8_8_ = 0;
  auVar273._0_8_ = local_188.z.n[1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_108.z.n[2];
  auVar274._8_8_ = 0;
  auVar274._0_8_ = local_188.z.n[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_108.z.n[3];
  auVar275._8_8_ = 0;
  auVar275._0_8_ = local_188.z.n[4];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_108.z.n[4];
  auVar276._8_8_ = 0;
  auVar276._0_8_ = local_188.z.n[3];
  auVar2 = auVar27 * auVar275 + auVar470 + auVar28 * auVar276;
  uVar529 = auVar2._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar529 & 0xfffffffffffff;
  auVar1 = auVar24 * auVar272 + auVar469 + auVar25 * auVar273 + auVar26 * auVar274 +
           auVar29 * ZEXT816(0x1000003d10);
  uVar535 = auVar1._0_8_;
  local_1b0.n[2] = uVar535 & 0xfffffffffffff;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = (uVar535 >> 0x34 | auVar1._8_8_ << 0xc) + local_208;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar529 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar471 = auVar30 * ZEXT816(0x1000003d10) + auVar471;
  uVar529 = auVar471._0_8_;
  local_1b0.n[3] = uVar529 & 0xfffffffffffff;
  local_1b0.n[4] = (uVar529 >> 0x34 | auVar471._8_8_ << 0xc) + (uVar528 & 0xffffffffffff);
  secp256k1_fe_inv(&local_1b0,&local_1b0);
  secp256k1_ge_set_gej_zinv(&local_268,&local_188,&local_1b0);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)(lVar534 + 0x7ffc0),&local_268);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_188.z.n[0];
  auVar277._8_8_ = 0;
  auVar277._0_8_ = local_1b0.n[3];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_188.z.n[1];
  auVar278._8_8_ = 0;
  auVar278._0_8_ = local_1b0.n[2];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_188.z.n[2];
  auVar279._8_8_ = 0;
  auVar279._0_8_ = local_1b0.n[1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_188.z.n[3];
  auVar280._8_8_ = 0;
  auVar280._0_8_ = local_1b0.n[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_188.z.n[4];
  auVar281._8_8_ = 0;
  auVar281._0_8_ = local_1b0.n[4];
  uVar528 = SUB168(auVar35 * auVar281,0);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar528 & 0xfffffffffffff;
  auVar1 = auVar32 * auVar278 + auVar31 * auVar277 + auVar33 * auVar279 + auVar34 * auVar280 +
           auVar36 * ZEXT816(0x1000003d10);
  uVar529 = auVar1._0_8_;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uVar529 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_188.z.n[0];
  auVar282._8_8_ = 0;
  auVar282._0_8_ = local_1b0.n[4];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_188.z.n[1];
  auVar283._8_8_ = 0;
  auVar283._0_8_ = local_1b0.n[3];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_188.z.n[2];
  auVar284._8_8_ = 0;
  auVar284._0_8_ = local_1b0.n[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_188.z.n[3];
  auVar285._8_8_ = 0;
  auVar285._0_8_ = local_1b0.n[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_188.z.n[4];
  auVar286._8_8_ = 0;
  auVar286._0_8_ = local_1b0.n[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar528 >> 0x34 | SUB168(auVar35 * auVar281,8) << 0xc;
  auVar1 = auVar37 * auVar282 + auVar472 + auVar38 * auVar283 + auVar39 * auVar284 +
           auVar40 * auVar285 + auVar41 * auVar286 + auVar42 * ZEXT816(0x1000003d10);
  uVar528 = auVar1._0_8_;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = uVar528 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_188.z.n[0];
  auVar287._8_8_ = 0;
  auVar287._0_8_ = local_1b0.n[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_188.z.n[1];
  auVar288._8_8_ = 0;
  auVar288._0_8_ = local_1b0.n[4];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_188.z.n[2];
  auVar289._8_8_ = 0;
  auVar289._0_8_ = local_1b0.n[3];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_188.z.n[3];
  auVar290._8_8_ = 0;
  auVar290._0_8_ = local_1b0.n[2];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_188.z.n[4];
  auVar291._8_8_ = 0;
  auVar291._0_8_ = local_1b0.n[1];
  auVar1 = auVar44 * auVar288 + auVar473 + auVar45 * auVar289 + auVar46 * auVar290 +
           auVar47 * auVar291;
  uVar535 = auVar1._0_8_;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uVar535 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = (uVar535 & 0xfffffffffffff) << 4 | (uVar528 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar43 * auVar287 + ZEXT816(0x1000003d1) * auVar292;
  uVar535 = auVar1._0_8_;
  local_108.z.n[0] = uVar535 & 0xfffffffffffff;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uVar535 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_188.z.n[0];
  auVar293._8_8_ = 0;
  auVar293._0_8_ = local_1b0.n[1];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_188.z.n[1];
  auVar294._8_8_ = 0;
  auVar294._0_8_ = local_1b0.n[0];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_188.z.n[2];
  auVar295._8_8_ = 0;
  auVar295._0_8_ = local_1b0.n[4];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_188.z.n[3];
  auVar296._8_8_ = 0;
  auVar296._0_8_ = local_1b0.n[3];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_188.z.n[4];
  auVar297._8_8_ = 0;
  auVar297._0_8_ = local_1b0.n[2];
  auVar2 = auVar50 * auVar295 + auVar475 + auVar51 * auVar296 + auVar52 * auVar297;
  uVar535 = auVar2._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar535 & 0xfffffffffffff;
  auVar1 = auVar48 * auVar293 + auVar474 + auVar49 * auVar294 + auVar53 * ZEXT816(0x1000003d10);
  uVar536 = auVar1._0_8_;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uVar535 >> 0x34 | auVar2._8_8_ << 0xc;
  local_108.z.n[1] = uVar536 & 0xfffffffffffff;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar536 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_188.z.n[0];
  auVar298._8_8_ = 0;
  auVar298._0_8_ = local_1b0.n[2];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_188.z.n[1];
  auVar299._8_8_ = 0;
  auVar299._0_8_ = local_1b0.n[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_188.z.n[2];
  auVar300._8_8_ = 0;
  auVar300._0_8_ = local_1b0.n[0];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_188.z.n[3];
  auVar301._8_8_ = 0;
  auVar301._0_8_ = local_1b0.n[4];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_188.z.n[4];
  auVar302._8_8_ = 0;
  auVar302._0_8_ = local_1b0.n[3];
  auVar2 = auVar57 * auVar301 + auVar477 + auVar58 * auVar302;
  uVar535 = auVar2._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar535 & 0xfffffffffffff;
  auVar1 = auVar54 * auVar298 + auVar476 + auVar55 * auVar299 + auVar56 * auVar300 +
           auVar59 * ZEXT816(0x1000003d10);
  uVar536 = auVar1._0_8_;
  local_108.z.n[2] = uVar536 & 0xfffffffffffff;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = (uVar536 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar529 & 0xfffffffffffff);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar535 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar478 = auVar60 * ZEXT816(0x1000003d10) + auVar478;
  uVar529 = auVar478._0_8_;
  local_108.z.n[3] = uVar529 & 0xfffffffffffff;
  local_108.z.n[4] = (uVar529 >> 0x34 | auVar478._8_8_ << 0xc) + (uVar528 & 0xffffffffffff);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_108.z.n[0] * 2;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = local_108.z.n[3];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_108.z.n[1] * 2;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = local_108.z.n[2];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_108.z.n[4];
  auVar305._8_8_ = 0;
  auVar305._0_8_ = local_108.z.n[4];
  uVar529 = SUB168(auVar63 * auVar305,0);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar529 & 0xfffffffffffff;
  auVar1 = auVar62 * auVar304 + auVar61 * auVar303 + auVar64 * ZEXT816(0x1000003d10);
  uVar536 = auVar1._0_8_;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = uVar536 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar528 = local_108.z.n[4] * 2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_108.z.n[0];
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar528;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_108.z.n[1] * 2;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = local_108.z.n[3];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_108.z.n[2];
  auVar308._8_8_ = 0;
  auVar308._0_8_ = local_108.z.n[2];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar529 >> 0x34 | SUB168(auVar63 * auVar305,8) << 0xc;
  auVar1 = auVar65 * auVar306 + auVar479 + auVar66 * auVar307 + auVar67 * auVar308 +
           auVar68 * ZEXT816(0x1000003d10);
  uVar533 = auVar1._0_8_;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uVar533 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_108.z.n[0];
  auVar309._8_8_ = 0;
  auVar309._0_8_ = local_108.z.n[0];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_108.z.n[1];
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar528;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_108.z.n[2] * 2;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = local_108.z.n[3];
  auVar1 = auVar70 * auVar310 + auVar480 + auVar71 * auVar311;
  uVar529 = auVar1._0_8_;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar529 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = (uVar529 & 0xfffffffffffff) << 4 | (uVar533 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar69 * auVar309 + ZEXT816(0x1000003d1) * auVar312;
  uVar535 = auVar1._0_8_;
  uVar529 = uVar535 & 0xfffffffffffff;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uVar535 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_108.z.n[0] * 2;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = local_108.z.n[1];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_108.z.n[2];
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar528;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_108.z.n[3];
  auVar315._8_8_ = 0;
  auVar315._0_8_ = local_108.z.n[3];
  auVar2 = auVar73 * auVar314 + auVar482 + auVar74 * auVar315;
  uVar535 = auVar2._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar535 & 0xfffffffffffff;
  auVar1 = auVar72 * auVar313 + auVar481 + auVar75 * ZEXT816(0x1000003d10);
  uVar537 = auVar1._0_8_;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uVar535 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar535 = uVar537 & 0xfffffffffffff;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uVar537 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_108.z.n[0] * 2;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = local_108.z.n[2];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_108.z.n[1];
  auVar317._8_8_ = 0;
  auVar317._0_8_ = local_108.z.n[1];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_108.z.n[3];
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar528;
  auVar484 = auVar78 * auVar318 + auVar484;
  uVar537 = auVar484._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar537 & 0xfffffffffffff;
  auVar1 = auVar76 * auVar316 + auVar483 + auVar77 * auVar317 + auVar79 * ZEXT816(0x1000003d10);
  uVar538 = auVar1._0_8_;
  uVar528 = uVar538 & 0xfffffffffffff;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = (uVar538 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar536 & 0xfffffffffffff);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar537 >> 0x34 | auVar484._8_8_ << 0xc;
  auVar485 = auVar80 * ZEXT816(0x1000003d10) + auVar485;
  uVar537 = auVar485._0_8_;
  uVar536 = uVar537 & 0xfffffffffffff;
  uVar539 = (uVar537 >> 0x34 | auVar485._8_8_ << 0xc) + (uVar533 & 0xffffffffffff);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_108.x.n[0];
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar536;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_108.x.n[1];
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar528;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_108.x.n[2];
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar535;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = local_108.x.n[3];
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar529;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_108.x.n[4];
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar539;
  uVar533 = SUB168(auVar85 * auVar323,0);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar533 & 0xfffffffffffff;
  auVar1 = auVar82 * auVar320 + auVar81 * auVar319 + auVar83 * auVar321 + auVar84 * auVar322 +
           auVar86 * ZEXT816(0x1000003d10);
  uVar537 = auVar1._0_8_;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar537 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_108.x.n[0];
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar539;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_108.x.n[1];
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar536;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_108.x.n[2];
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar528;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_108.x.n[3];
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar535;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = local_108.x.n[4];
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar529;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar533 >> 0x34 | SUB168(auVar85 * auVar323,8) << 0xc;
  auVar1 = auVar87 * auVar324 + auVar486 + auVar88 * auVar325 + auVar89 * auVar326 +
           auVar90 * auVar327 + auVar91 * auVar328 + auVar92 * ZEXT816(0x1000003d10);
  uVar533 = auVar1._0_8_;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar533 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = local_108.x.n[0];
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar529;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_108.x.n[1];
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar539;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = local_108.x.n[2];
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar536;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_108.x.n[3];
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar528;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = local_108.x.n[4];
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar535;
  auVar1 = auVar94 * auVar330 + auVar487 + auVar95 * auVar331 + auVar96 * auVar332 +
           auVar97 * auVar333;
  uVar538 = auVar1._0_8_;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar538 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = (uVar538 & 0xfffffffffffff) << 4 | (uVar533 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar93 * auVar329 + ZEXT816(0x1000003d1) * auVar334;
  uVar538 = auVar1._0_8_;
  local_208 = uVar538 & 0xfffffffffffff;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar538 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = local_108.x.n[0];
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar535;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = local_108.x.n[1];
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar529;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = local_108.x.n[2];
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar539;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = local_108.x.n[3];
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar536;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_108.x.n[4];
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar528;
  auVar2 = auVar100 * auVar337 + auVar489 + auVar101 * auVar338 + auVar102 * auVar339;
  uVar538 = auVar2._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar538 & 0xfffffffffffff;
  auVar1 = auVar98 * auVar335 + auVar488 + auVar99 * auVar336 + auVar103 * ZEXT816(0x1000003d10);
  uVar540 = auVar1._0_8_;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar538 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_200 = uVar540 & 0xfffffffffffff;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar540 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = local_108.x.n[0];
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar528;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = local_108.x.n[1];
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar535;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = local_108.x.n[2];
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar529;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_108.x.n[3];
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar539;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = local_108.x.n[4];
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar536;
  auVar2 = auVar107 * auVar343 + auVar491 + auVar108 * auVar344;
  uVar528 = auVar2._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar528 & 0xfffffffffffff;
  auVar1 = auVar104 * auVar340 + auVar490 + auVar105 * auVar341 + auVar106 * auVar342 +
           auVar109 * ZEXT816(0x1000003d10);
  uVar529 = auVar1._0_8_;
  local_1f8 = uVar529 & 0xfffffffffffff;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = (uVar529 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar537 & 0xfffffffffffff);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar528 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar492 = auVar110 * ZEXT816(0x1000003d10) + auVar492;
  uVar528 = auVar492._0_8_;
  uStack_1f0 = uVar528 & 0xfffffffffffff;
  local_1e8 = (uVar528 >> 0x34 | auVar492._8_8_ << 0xc) + (uVar533 & 0xffffffffffff);
  a_00 = (secp256k1_ge_storage *)(lVar534 + 0x7ff80);
  uVar528 = 0x2000;
  do {
    secp256k1_ge_from_storage(&local_268,a_00);
    auVar111._8_8_ = 0;
    auVar111._0_8_ = local_268.x.n[0];
    auVar345._8_8_ = 0;
    auVar345._0_8_ = local_1b0.n[3];
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_268.x.n[1];
    auVar346._8_8_ = 0;
    auVar346._0_8_ = local_1b0.n[2];
    auVar113._8_8_ = 0;
    auVar113._0_8_ = local_268.x.n[2];
    auVar347._8_8_ = 0;
    auVar347._0_8_ = local_1b0.n[1];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_268.x.n[3];
    auVar348._8_8_ = 0;
    auVar348._0_8_ = local_1b0.n[0];
    auVar115._8_8_ = 0;
    auVar115._0_8_ = local_268.x.n[4];
    auVar349._8_8_ = 0;
    auVar349._0_8_ = local_1b0.n[4];
    uVar529 = SUB168(auVar115 * auVar349,0);
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar529 & 0xfffffffffffff;
    auVar1 = auVar112 * auVar346 + auVar111 * auVar345 + auVar113 * auVar347 + auVar114 * auVar348 +
             auVar116 * ZEXT816(0x1000003d10);
    uVar533 = auVar1._0_8_;
    auVar493._8_8_ = 0;
    auVar493._0_8_ = uVar533 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = local_268.x.n[0];
    auVar350._8_8_ = 0;
    auVar350._0_8_ = local_1b0.n[4];
    auVar118._8_8_ = 0;
    auVar118._0_8_ = local_268.x.n[1];
    auVar351._8_8_ = 0;
    auVar351._0_8_ = local_1b0.n[3];
    auVar119._8_8_ = 0;
    auVar119._0_8_ = local_268.x.n[2];
    auVar352._8_8_ = 0;
    auVar352._0_8_ = local_1b0.n[2];
    auVar120._8_8_ = 0;
    auVar120._0_8_ = local_268.x.n[3];
    auVar353._8_8_ = 0;
    auVar353._0_8_ = local_1b0.n[1];
    auVar121._8_8_ = 0;
    auVar121._0_8_ = local_268.x.n[4];
    auVar354._8_8_ = 0;
    auVar354._0_8_ = local_1b0.n[0];
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar529 >> 0x34 | SUB168(auVar115 * auVar349,8) << 0xc;
    auVar1 = auVar117 * auVar350 + auVar493 + auVar118 * auVar351 + auVar119 * auVar352 +
             auVar120 * auVar353 + auVar121 * auVar354 + auVar122 * ZEXT816(0x1000003d10);
    uVar529 = auVar1._0_8_;
    auVar494._8_8_ = 0;
    auVar494._0_8_ = uVar529 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = local_268.x.n[0];
    auVar355._8_8_ = 0;
    auVar355._0_8_ = local_1b0.n[0];
    auVar124._8_8_ = 0;
    auVar124._0_8_ = local_268.x.n[1];
    auVar356._8_8_ = 0;
    auVar356._0_8_ = local_1b0.n[4];
    auVar125._8_8_ = 0;
    auVar125._0_8_ = local_268.x.n[2];
    auVar357._8_8_ = 0;
    auVar357._0_8_ = local_1b0.n[3];
    auVar126._8_8_ = 0;
    auVar126._0_8_ = local_268.x.n[3];
    auVar358._8_8_ = 0;
    auVar358._0_8_ = local_1b0.n[2];
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_268.x.n[4];
    auVar359._8_8_ = 0;
    auVar359._0_8_ = local_1b0.n[1];
    auVar1 = auVar124 * auVar356 + auVar494 + auVar125 * auVar357 + auVar126 * auVar358 +
             auVar127 * auVar359;
    uVar535 = auVar1._0_8_;
    auVar496._8_8_ = 0;
    auVar496._0_8_ = uVar535 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar360._8_8_ = 0;
    auVar360._0_8_ = (uVar535 & 0xfffffffffffff) << 4 | (uVar529 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar123 * auVar355 + ZEXT816(0x1000003d1) * auVar360;
    uVar536 = auVar1._0_8_;
    uVar535 = uVar536 & 0xfffffffffffff;
    auVar495._8_8_ = 0;
    auVar495._0_8_ = uVar536 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = local_268.x.n[0];
    auVar361._8_8_ = 0;
    auVar361._0_8_ = local_1b0.n[1];
    auVar129._8_8_ = 0;
    auVar129._0_8_ = local_268.x.n[1];
    auVar362._8_8_ = 0;
    auVar362._0_8_ = local_1b0.n[0];
    auVar130._8_8_ = 0;
    auVar130._0_8_ = local_268.x.n[2];
    auVar363._8_8_ = 0;
    auVar363._0_8_ = local_1b0.n[4];
    auVar131._8_8_ = 0;
    auVar131._0_8_ = local_268.x.n[3];
    auVar364._8_8_ = 0;
    auVar364._0_8_ = local_1b0.n[3];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = local_268.x.n[4];
    auVar365._8_8_ = 0;
    auVar365._0_8_ = local_1b0.n[2];
    auVar2 = auVar130 * auVar363 + auVar496 + auVar131 * auVar364 + auVar132 * auVar365;
    uVar536 = auVar2._0_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar536 & 0xfffffffffffff;
    auVar1 = auVar128 * auVar361 + auVar495 + auVar129 * auVar362 + auVar133 * ZEXT816(0x1000003d10)
    ;
    uVar537 = auVar1._0_8_;
    auVar498._8_8_ = 0;
    auVar498._0_8_ = uVar536 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar536 = uVar537 & 0xfffffffffffff;
    auVar497._8_8_ = 0;
    auVar497._0_8_ = uVar537 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_268.x.n[0];
    auVar366._8_8_ = 0;
    auVar366._0_8_ = local_1b0.n[2];
    auVar135._8_8_ = 0;
    auVar135._0_8_ = local_268.x.n[1];
    auVar367._8_8_ = 0;
    auVar367._0_8_ = local_1b0.n[1];
    auVar136._8_8_ = 0;
    auVar136._0_8_ = local_268.x.n[2];
    auVar368._8_8_ = 0;
    auVar368._0_8_ = local_1b0.n[0];
    auVar137._8_8_ = 0;
    auVar137._0_8_ = local_268.x.n[3];
    auVar369._8_8_ = 0;
    auVar369._0_8_ = local_1b0.n[4];
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_268.x.n[4];
    auVar370._8_8_ = 0;
    auVar370._0_8_ = local_1b0.n[3];
    auVar2 = auVar137 * auVar369 + auVar498 + auVar138 * auVar370;
    uVar537 = auVar2._0_8_;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = uVar537 & 0xfffffffffffff;
    auVar1 = auVar134 * auVar366 + auVar497 + auVar135 * auVar367 + auVar136 * auVar368 +
             auVar139 * ZEXT816(0x1000003d10);
    uVar538 = auVar1._0_8_;
    local_1b0.n[2] = uVar538 & 0xfffffffffffff;
    auVar499._8_8_ = 0;
    auVar499._0_8_ = (uVar538 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar533 & 0xfffffffffffff);
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar537 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar499 = auVar140 * ZEXT816(0x1000003d10) + auVar499;
    uVar533 = auVar499._0_8_;
    local_1b0.n[3] = uVar533 & 0xfffffffffffff;
    local_1b0.n[4] = (uVar533 >> 0x34 | auVar499._8_8_ << 0xc) + (uVar529 & 0xffffffffffff);
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar535 * 2;
    auVar371._8_8_ = 0;
    auVar371._0_8_ = local_1b0.n[3];
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar536 * 2;
    auVar372._8_8_ = 0;
    auVar372._0_8_ = local_1b0.n[2];
    auVar143._8_8_ = 0;
    auVar143._0_8_ = local_1b0.n[4];
    auVar373._8_8_ = 0;
    auVar373._0_8_ = local_1b0.n[4];
    uVar533 = SUB168(auVar143 * auVar373,0);
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar533 & 0xfffffffffffff;
    auVar1 = auVar142 * auVar372 + auVar141 * auVar371 + auVar144 * ZEXT816(0x1000003d10);
    uVar538 = auVar1._0_8_;
    auVar500._8_8_ = 0;
    auVar500._0_8_ = uVar538 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar529 = local_1b0.n[4] * 2;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar535;
    auVar374._8_8_ = 0;
    auVar374._0_8_ = uVar529;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar536 * 2;
    auVar375._8_8_ = 0;
    auVar375._0_8_ = local_1b0.n[3];
    auVar147._8_8_ = 0;
    auVar147._0_8_ = local_1b0.n[2];
    auVar376._8_8_ = 0;
    auVar376._0_8_ = local_1b0.n[2];
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar533 >> 0x34 | SUB168(auVar143 * auVar373,8) << 0xc;
    auVar1 = auVar145 * auVar374 + auVar500 + auVar146 * auVar375 + auVar147 * auVar376 +
             auVar148 * ZEXT816(0x1000003d10);
    uVar539 = auVar1._0_8_;
    auVar501._8_8_ = 0;
    auVar501._0_8_ = uVar539 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar535;
    auVar377._8_8_ = 0;
    auVar377._0_8_ = uVar535;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar536;
    auVar378._8_8_ = 0;
    auVar378._0_8_ = uVar529;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_1b0.n[2] * 2;
    auVar379._8_8_ = 0;
    auVar379._0_8_ = local_1b0.n[3];
    auVar1 = auVar150 * auVar378 + auVar501 + auVar151 * auVar379;
    uVar533 = auVar1._0_8_;
    auVar503._8_8_ = 0;
    auVar503._0_8_ = uVar533 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar380._8_8_ = 0;
    auVar380._0_8_ = (uVar533 & 0xfffffffffffff) << 4 | (uVar539 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar149 * auVar377 + ZEXT816(0x1000003d1) * auVar380;
    uVar537 = auVar1._0_8_;
    uVar533 = uVar537 & 0xfffffffffffff;
    auVar502._8_8_ = 0;
    auVar502._0_8_ = uVar537 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar535 * 2;
    auVar381._8_8_ = 0;
    auVar381._0_8_ = uVar536;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = local_1b0.n[2];
    auVar382._8_8_ = 0;
    auVar382._0_8_ = uVar529;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = local_1b0.n[3];
    auVar383._8_8_ = 0;
    auVar383._0_8_ = local_1b0.n[3];
    auVar2 = auVar153 * auVar382 + auVar503 + auVar154 * auVar383;
    uVar537 = auVar2._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar537 & 0xfffffffffffff;
    auVar1 = auVar152 * auVar381 + auVar502 + auVar155 * ZEXT816(0x1000003d10);
    uVar540 = auVar1._0_8_;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = uVar537 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar537 = uVar540 & 0xfffffffffffff;
    auVar504._8_8_ = 0;
    auVar504._0_8_ = uVar540 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar535 * 2;
    auVar384._8_8_ = 0;
    auVar384._0_8_ = local_1b0.n[2];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar536;
    auVar385._8_8_ = 0;
    auVar385._0_8_ = uVar536;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = local_1b0.n[3];
    auVar386._8_8_ = 0;
    auVar386._0_8_ = uVar529;
    auVar505 = auVar158 * auVar386 + auVar505;
    uVar540 = auVar505._0_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar540 & 0xfffffffffffff;
    auVar1 = auVar156 * auVar384 + auVar504 + auVar157 * auVar385 + auVar159 * ZEXT816(0x1000003d10)
    ;
    uVar541 = auVar1._0_8_;
    uVar529 = uVar541 & 0xfffffffffffff;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = (uVar541 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar538 & 0xfffffffffffff);
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar540 >> 0x34 | auVar505._8_8_ << 0xc;
    auVar506 = auVar160 * ZEXT816(0x1000003d10) + auVar506;
    uVar540 = auVar506._0_8_;
    uVar538 = uVar540 & 0xfffffffffffff;
    uVar542 = (uVar540 >> 0x34 | auVar506._8_8_ << 0xc) + (uVar539 & 0xffffffffffff);
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar535;
    auVar387._8_8_ = 0;
    auVar387._0_8_ = uVar538;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar536;
    auVar388._8_8_ = 0;
    auVar388._0_8_ = uVar529;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_1b0.n[2];
    auVar389._8_8_ = 0;
    auVar389._0_8_ = uVar537;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = local_1b0.n[3];
    auVar390._8_8_ = 0;
    auVar390._0_8_ = uVar533;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_1b0.n[4];
    auVar391._8_8_ = 0;
    auVar391._0_8_ = uVar542;
    uVar539 = SUB168(auVar165 * auVar391,0);
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar539 & 0xfffffffffffff;
    auVar1 = auVar162 * auVar388 + auVar161 * auVar387 + auVar163 * auVar389 + auVar164 * auVar390 +
             auVar166 * ZEXT816(0x1000003d10);
    uVar530 = auVar1._0_8_;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = uVar530 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar535;
    auVar392._8_8_ = 0;
    auVar392._0_8_ = uVar542;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar536;
    auVar393._8_8_ = 0;
    auVar393._0_8_ = uVar538;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = local_1b0.n[2];
    auVar394._8_8_ = 0;
    auVar394._0_8_ = uVar529;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = local_1b0.n[3];
    auVar395._8_8_ = 0;
    auVar395._0_8_ = uVar537;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = local_1b0.n[4];
    auVar396._8_8_ = 0;
    auVar396._0_8_ = uVar533;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar539 >> 0x34 | SUB168(auVar165 * auVar391,8) << 0xc;
    auVar1 = auVar167 * auVar392 + auVar507 + auVar168 * auVar393 + auVar169 * auVar394 +
             auVar170 * auVar395 + auVar171 * auVar396 + auVar172 * ZEXT816(0x1000003d10);
    uVar531 = auVar1._0_8_;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = uVar531 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar535;
    auVar397._8_8_ = 0;
    auVar397._0_8_ = uVar533;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar536;
    auVar398._8_8_ = 0;
    auVar398._0_8_ = uVar542;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = local_1b0.n[2];
    auVar399._8_8_ = 0;
    auVar399._0_8_ = uVar538;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = local_1b0.n[3];
    auVar400._8_8_ = 0;
    auVar400._0_8_ = uVar529;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = local_1b0.n[4];
    auVar401._8_8_ = 0;
    auVar401._0_8_ = uVar537;
    auVar1 = auVar174 * auVar398 + auVar508 + auVar175 * auVar399 + auVar176 * auVar400 +
             auVar177 * auVar401;
    uVar539 = auVar1._0_8_;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = uVar539 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar402._8_8_ = 0;
    auVar402._0_8_ = (uVar539 & 0xfffffffffffff) << 4 | (uVar531 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar173 * auVar397 + ZEXT816(0x1000003d1) * auVar402;
    uVar540 = auVar1._0_8_;
    uVar539 = uVar540 & 0xfffffffffffff;
    auVar509._8_8_ = 0;
    auVar509._0_8_ = uVar540 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar535;
    auVar403._8_8_ = 0;
    auVar403._0_8_ = uVar537;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar536;
    auVar404._8_8_ = 0;
    auVar404._0_8_ = uVar533;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = local_1b0.n[2];
    auVar405._8_8_ = 0;
    auVar405._0_8_ = uVar542;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_1b0.n[3];
    auVar406._8_8_ = 0;
    auVar406._0_8_ = uVar538;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_1b0.n[4];
    auVar407._8_8_ = 0;
    auVar407._0_8_ = uVar529;
    auVar2 = auVar180 * auVar405 + auVar510 + auVar181 * auVar406 + auVar182 * auVar407;
    uVar540 = auVar2._0_8_;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar540 & 0xfffffffffffff;
    auVar1 = auVar178 * auVar403 + auVar509 + auVar179 * auVar404 + auVar183 * ZEXT816(0x1000003d10)
    ;
    uVar541 = auVar1._0_8_;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = uVar540 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar540 = uVar541 & 0xfffffffffffff;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = uVar541 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar535;
    auVar408._8_8_ = 0;
    auVar408._0_8_ = uVar529;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar536;
    auVar409._8_8_ = 0;
    auVar409._0_8_ = uVar537;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = local_1b0.n[2];
    auVar410._8_8_ = 0;
    auVar410._0_8_ = uVar533;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = local_1b0.n[3];
    auVar411._8_8_ = 0;
    auVar411._0_8_ = uVar542;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = local_1b0.n[4];
    auVar412._8_8_ = 0;
    auVar412._0_8_ = uVar538;
    auVar2 = auVar187 * auVar411 + auVar512 + auVar188 * auVar412;
    uVar532 = auVar2._0_8_;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar532 & 0xfffffffffffff;
    auVar1 = auVar184 * auVar408 + auVar511 + auVar185 * auVar409 + auVar186 * auVar410 +
             auVar189 * ZEXT816(0x1000003d10);
    uVar543 = auVar1._0_8_;
    uVar541 = uVar543 & 0xfffffffffffff;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = (uVar543 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar530 & 0xfffffffffffff);
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar532 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar513 = auVar190 * ZEXT816(0x1000003d10) + auVar513;
    uVar532 = auVar513._0_8_;
    uVar530 = uVar532 & 0xfffffffffffff;
    uVar544 = (uVar532 >> 0x34 | auVar513._8_8_ << 0xc) + (uVar531 & 0xffffffffffff);
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar533;
    auVar413._8_8_ = 0;
    auVar413._0_8_ = local_268.x.n[3];
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar537;
    auVar414._8_8_ = 0;
    auVar414._0_8_ = local_268.x.n[2];
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar529;
    auVar415._8_8_ = 0;
    auVar415._0_8_ = local_268.x.n[1];
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar538;
    auVar416._8_8_ = 0;
    auVar416._0_8_ = local_268.x.n[0];
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar542;
    auVar417._8_8_ = 0;
    auVar417._0_8_ = local_268.x.n[4];
    uVar531 = SUB168(auVar195 * auVar417,0);
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar531 & 0xfffffffffffff;
    auVar1 = auVar192 * auVar414 + auVar191 * auVar413 + auVar193 * auVar415 + auVar194 * auVar416 +
             auVar196 * ZEXT816(0x1000003d10);
    uVar532 = auVar1._0_8_;
    auVar514._8_8_ = 0;
    auVar514._0_8_ = uVar532 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar533;
    auVar418._8_8_ = 0;
    auVar418._0_8_ = local_268.x.n[4];
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar537;
    auVar419._8_8_ = 0;
    auVar419._0_8_ = local_268.x.n[3];
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar529;
    auVar420._8_8_ = 0;
    auVar420._0_8_ = local_268.x.n[2];
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar538;
    auVar421._8_8_ = 0;
    auVar421._0_8_ = local_268.x.n[1];
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar542;
    auVar422._8_8_ = 0;
    auVar422._0_8_ = local_268.x.n[0];
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar531 >> 0x34 | SUB168(auVar195 * auVar417,8) << 0xc;
    auVar1 = auVar197 * auVar418 + auVar514 + auVar198 * auVar419 + auVar199 * auVar420 +
             auVar200 * auVar421 + auVar201 * auVar422 + auVar202 * ZEXT816(0x1000003d10);
    uVar531 = auVar1._0_8_;
    auVar515._8_8_ = 0;
    auVar515._0_8_ = uVar531 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar533;
    auVar423._8_8_ = 0;
    auVar423._0_8_ = local_268.x.n[0];
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar537;
    auVar424._8_8_ = 0;
    auVar424._0_8_ = local_268.x.n[4];
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar529;
    auVar425._8_8_ = 0;
    auVar425._0_8_ = local_268.x.n[3];
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar538;
    auVar426._8_8_ = 0;
    auVar426._0_8_ = local_268.x.n[2];
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar542;
    auVar427._8_8_ = 0;
    auVar427._0_8_ = local_268.x.n[1];
    auVar1 = auVar204 * auVar424 + auVar515 + auVar205 * auVar425 + auVar206 * auVar426 +
             auVar207 * auVar427;
    uVar543 = auVar1._0_8_;
    auVar517._8_8_ = 0;
    auVar517._0_8_ = uVar543 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar428._8_8_ = 0;
    auVar428._0_8_ = (uVar543 & 0xfffffffffffff) << 4 | (uVar531 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar203 * auVar423 + ZEXT816(0x1000003d1) * auVar428;
    uVar545 = auVar1._0_8_;
    auVar516._8_8_ = 0;
    auVar516._0_8_ = uVar545 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar533;
    auVar429._8_8_ = 0;
    auVar429._0_8_ = local_268.x.n[1];
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar537;
    auVar430._8_8_ = 0;
    auVar430._0_8_ = local_268.x.n[0];
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar529;
    auVar431._8_8_ = 0;
    auVar431._0_8_ = local_268.x.n[4];
    auVar211._8_8_ = 0;
    auVar211._0_8_ = uVar538;
    auVar432._8_8_ = 0;
    auVar432._0_8_ = local_268.x.n[3];
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar542;
    auVar433._8_8_ = 0;
    auVar433._0_8_ = local_268.x.n[2];
    auVar2 = auVar210 * auVar431 + auVar517 + auVar211 * auVar432 + auVar212 * auVar433;
    uVar543 = auVar2._0_8_;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = uVar543 & 0xfffffffffffff;
    auVar1 = auVar208 * auVar429 + auVar516 + auVar209 * auVar430 + auVar213 * ZEXT816(0x1000003d10)
    ;
    uVar546 = auVar1._0_8_;
    auVar519._8_8_ = 0;
    auVar519._0_8_ = uVar543 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar518._8_8_ = 0;
    auVar518._0_8_ = uVar546 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar533;
    auVar434._8_8_ = 0;
    auVar434._0_8_ = local_268.x.n[2];
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar537;
    auVar435._8_8_ = 0;
    auVar435._0_8_ = local_268.x.n[1];
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar529;
    auVar436._8_8_ = 0;
    auVar436._0_8_ = local_268.x.n[0];
    auVar217._8_8_ = 0;
    auVar217._0_8_ = uVar538;
    auVar437._8_8_ = 0;
    auVar437._0_8_ = local_268.x.n[4];
    auVar218._8_8_ = 0;
    auVar218._0_8_ = uVar542;
    auVar438._8_8_ = 0;
    auVar438._0_8_ = local_268.x.n[3];
    auVar2 = auVar217 * auVar437 + auVar519 + auVar218 * auVar438;
    uVar529 = auVar2._0_8_;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar529 & 0xfffffffffffff;
    auVar1 = auVar214 * auVar434 + auVar518 + auVar215 * auVar435 + auVar216 * auVar436 +
             auVar219 * ZEXT816(0x1000003d10);
    uVar533 = auVar1._0_8_;
    auVar520._8_8_ = 0;
    auVar520._0_8_ = (uVar533 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar532 & 0xfffffffffffff);
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar529 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar520 = auVar220 * ZEXT816(0x1000003d10) + auVar520;
    uVar529 = auVar520._0_8_;
    local_268.x.n[0] = (local_208 - (uVar545 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
    local_268.x.n[1] = (uStack_200 - (uVar546 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_268.x.n[2] = (local_1f8 - (uVar533 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_268.x.n[3] = (uStack_1f0 - (uVar529 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_268.x.n[4] =
         (local_1e8 - ((uVar529 >> 0x34 | auVar520._8_8_ << 0xc) + (uVar531 & 0xffffffffffff))) +
         0x3fffffffffffc;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = uVar539;
    auVar439._8_8_ = 0;
    auVar439._0_8_ = local_268.y.n[3];
    auVar222._8_8_ = 0;
    auVar222._0_8_ = uVar540;
    auVar440._8_8_ = 0;
    auVar440._0_8_ = local_268.y.n[2];
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uVar541;
    auVar441._8_8_ = 0;
    auVar441._0_8_ = local_268.y.n[1];
    auVar224._8_8_ = 0;
    auVar224._0_8_ = uVar530;
    auVar442._8_8_ = 0;
    auVar442._0_8_ = local_268.y.n[0];
    auVar225._8_8_ = 0;
    auVar225._0_8_ = uVar544;
    auVar443._8_8_ = 0;
    auVar443._0_8_ = local_268.y.n[4];
    uVar529 = SUB168(auVar225 * auVar443,0);
    auVar226._8_8_ = 0;
    auVar226._0_8_ = uVar529 & 0xfffffffffffff;
    auVar1 = auVar222 * auVar440 + auVar221 * auVar439 + auVar223 * auVar441 + auVar224 * auVar442 +
             auVar226 * ZEXT816(0x1000003d10);
    uVar533 = auVar1._0_8_;
    auVar521._8_8_ = 0;
    auVar521._0_8_ = uVar533 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar539;
    auVar444._8_8_ = 0;
    auVar444._0_8_ = local_268.y.n[4];
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar540;
    auVar445._8_8_ = 0;
    auVar445._0_8_ = local_268.y.n[3];
    auVar229._8_8_ = 0;
    auVar229._0_8_ = uVar541;
    auVar446._8_8_ = 0;
    auVar446._0_8_ = local_268.y.n[2];
    auVar230._8_8_ = 0;
    auVar230._0_8_ = uVar530;
    auVar447._8_8_ = 0;
    auVar447._0_8_ = local_268.y.n[1];
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar544;
    auVar448._8_8_ = 0;
    auVar448._0_8_ = local_268.y.n[0];
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar529 >> 0x34 | SUB168(auVar225 * auVar443,8) << 0xc;
    auVar1 = auVar227 * auVar444 + auVar521 + auVar228 * auVar445 + auVar229 * auVar446 +
             auVar230 * auVar447 + auVar231 * auVar448 + auVar232 * ZEXT816(0x1000003d10);
    uVar529 = auVar1._0_8_;
    auVar522._8_8_ = 0;
    auVar522._0_8_ = uVar529 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar539;
    auVar449._8_8_ = 0;
    auVar449._0_8_ = local_268.y.n[0];
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar540;
    auVar450._8_8_ = 0;
    auVar450._0_8_ = local_268.y.n[4];
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar541;
    auVar451._8_8_ = 0;
    auVar451._0_8_ = local_268.y.n[3];
    auVar236._8_8_ = 0;
    auVar236._0_8_ = uVar530;
    auVar452._8_8_ = 0;
    auVar452._0_8_ = local_268.y.n[2];
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar544;
    auVar453._8_8_ = 0;
    auVar453._0_8_ = local_268.y.n[1];
    auVar1 = auVar234 * auVar450 + auVar522 + auVar235 * auVar451 + auVar236 * auVar452 +
             auVar237 * auVar453;
    uVar537 = auVar1._0_8_;
    auVar524._8_8_ = 0;
    auVar524._0_8_ = uVar537 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar454._8_8_ = 0;
    auVar454._0_8_ = (uVar537 & 0xfffffffffffff) << 4 | (uVar529 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar233 * auVar449 + ZEXT816(0x1000003d1) * auVar454;
    uVar538 = auVar1._0_8_;
    auVar523._8_8_ = 0;
    auVar523._0_8_ = uVar538 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar539;
    auVar455._8_8_ = 0;
    auVar455._0_8_ = local_268.y.n[1];
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar540;
    auVar456._8_8_ = 0;
    auVar456._0_8_ = local_268.y.n[0];
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar541;
    auVar457._8_8_ = 0;
    auVar457._0_8_ = local_268.y.n[4];
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar530;
    auVar458._8_8_ = 0;
    auVar458._0_8_ = local_268.y.n[3];
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar544;
    auVar459._8_8_ = 0;
    auVar459._0_8_ = local_268.y.n[2];
    auVar2 = auVar240 * auVar457 + auVar524 + auVar241 * auVar458 + auVar242 * auVar459;
    uVar537 = auVar2._0_8_;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar537 & 0xfffffffffffff;
    auVar1 = auVar238 * auVar455 + auVar523 + auVar239 * auVar456 + auVar243 * ZEXT816(0x1000003d10)
    ;
    uVar531 = auVar1._0_8_;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = uVar537 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar525._8_8_ = 0;
    auVar525._0_8_ = uVar531 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar539;
    auVar460._8_8_ = 0;
    auVar460._0_8_ = local_268.y.n[2];
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar540;
    auVar461._8_8_ = 0;
    auVar461._0_8_ = local_268.y.n[1];
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar541;
    auVar462._8_8_ = 0;
    auVar462._0_8_ = local_268.y.n[0];
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar530;
    auVar463._8_8_ = 0;
    auVar463._0_8_ = local_268.y.n[4];
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar544;
    auVar464._8_8_ = 0;
    auVar464._0_8_ = local_268.y.n[3];
    auVar2 = auVar247 * auVar463 + auVar526 + auVar248 * auVar464;
    uVar537 = auVar2._0_8_;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = uVar537 & 0xfffffffffffff;
    auVar1 = auVar244 * auVar460 + auVar525 + auVar245 * auVar461 + auVar246 * auVar462 +
             auVar249 * ZEXT816(0x1000003d10);
    uVar539 = auVar1._0_8_;
    local_268.y.n[2] = uVar539 & 0xfffffffffffff;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = (uVar539 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar533 & 0xfffffffffffff);
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar537 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar527 = auVar250 * ZEXT816(0x1000003d10) + auVar527;
    uVar533 = auVar527._0_8_;
    local_268.y.n[3] = uVar533 & 0xfffffffffffff;
    local_268.y.n[4] = (uVar533 >> 0x34 | auVar527._8_8_ << 0xc) + (uVar529 & 0xffffffffffff);
    local_268.y.n[0] = uVar538 & 0xfffffffffffff;
    local_268.y.n[1] = uVar531 & 0xfffffffffffff;
    local_1b0.n[0] = uVar535;
    local_1b0.n[1] = uVar536;
    secp256k1_ge_to_storage(a_00,&local_268);
    uVar528 = uVar528 - 1;
    a_00 = a_00 + -1;
  } while (1 < uVar528);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table_storage_var(const int n, secp256k1_ge_storage *pre, const secp256k1_gej *a) {
    secp256k1_gej d;
    secp256k1_ge d_ge, p_ge;
    secp256k1_gej pj;
    secp256k1_fe zi;
    secp256k1_fe zr;
    secp256k1_fe dx_over_dz_squared;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /* First, we perform all the additions in an isomorphic curve obtained by multiplying
     * all `z` coordinates by 1/`d.z`. In these coordinates `d` is affine so we can use
     * `secp256k1_gej_add_ge_var` to perform the additions. For each addition, we store
     * the resulting y-coordinate and the z-ratio, since we only have enough memory to
     * store two field elements. These are sufficient to efficiently undo the isomorphism
     * and recompute all the `x`s.
     */
    d_ge.x = d.x;
    d_ge.y = d.y;
    d_ge.infinity = 0;

    secp256k1_ge_set_gej_zinv(&p_ge, a, &d.z);
    pj.x = p_ge.x;
    pj.y = p_ge.y;
    pj.z = a->z;
    pj.infinity = 0;

    for (i = 0; i < (n - 1); i++) {
        secp256k1_fe_normalize_var(&pj.y);
        secp256k1_fe_to_storage(&pre[i].y, &pj.y);
        secp256k1_gej_add_ge_var(&pj, &pj, &d_ge, &zr);
        secp256k1_fe_normalize_var(&zr);
        secp256k1_fe_to_storage(&pre[i].x, &zr);
    }

    /* Invert d.z in the same batch, preserving pj.z so we can extract 1/d.z */
    secp256k1_fe_mul(&zi, &pj.z, &d.z);
    secp256k1_fe_inv_var(&zi, &zi);

    /* Directly set `pre[n - 1]` to `pj`, saving the inverted z-coordinate so
     * that we can combine it with the saved z-ratios to compute the other zs
     * without any more inversions. */
    secp256k1_ge_set_gej_zinv(&p_ge, &pj, &zi);
    secp256k1_ge_to_storage(&pre[n - 1], &p_ge);

    /* Compute the actual x-coordinate of D, which will be needed below. */
    secp256k1_fe_mul(&d.z, &zi, &pj.z);  /* d.z = 1/d.z */
    secp256k1_fe_sqr(&dx_over_dz_squared, &d.z);
    secp256k1_fe_mul(&dx_over_dz_squared, &dx_over_dz_squared, &d.x);

    /* Going into the second loop, we have set `pre[n-1]` to its final affine
     * form, but still need to set `pre[i]` for `i` in 0 through `n-2`. We
     * have `zi = (p.z * d.z)^-1`, where
     *
     *     `p.z` is the z-coordinate of the point on the isomorphic curve
     *           which was ultimately assigned to `pre[n-1]`.
     *     `d.z` is the multiplier that must be applied to all z-coordinates
     *           to move from our isomorphic curve back to secp256k1; so the
     *           product `p.z * d.z` is the z-coordinate of the secp256k1
     *           point assigned to `pre[n-1]`.
     *
     * All subsequent inverse-z-coordinates can be obtained by multiplying this
     * factor by successive z-ratios, which is much more efficient than directly
     * computing each one.
     *
     * Importantly, these inverse-zs will be coordinates of points on secp256k1,
     * while our other stored values come from computations on the isomorphic
     * curve. So in the below loop, we will take care not to actually use `zi`
     * or any derived values until we're back on secp256k1.
     */
    i = n - 1;
    while (i > 0) {
        secp256k1_fe zi2, zi3;
        const secp256k1_fe *rzr;
        i--;

        secp256k1_ge_from_storage(&p_ge, &pre[i]);

        /* For each remaining point, we extract the z-ratio from the stored
         * x-coordinate, compute its z^-1 from that, and compute the full
         * point from that. */
        rzr = &p_ge.x;
        secp256k1_fe_mul(&zi, &zi, rzr);
        secp256k1_fe_sqr(&zi2, &zi);
        secp256k1_fe_mul(&zi3, &zi2, &zi);
        /* To compute the actual x-coordinate, we use the stored z ratio and
         * y-coordinate, which we obtained from `secp256k1_gej_add_ge_var`
         * in the loop above, as well as the inverse of the square of its
         * z-coordinate. We store the latter in the `zi2` variable, which is
         * computed iteratively starting from the overall Z inverse then
         * multiplying by each z-ratio in turn.
         *
         * Denoting the z-ratio as `rzr`, we observe that it is equal to `h`
         * from the inside of the above `gej_add_ge_var` call. This satisfies
         *
         *    rzr = d_x * z^2 - x * d_z^2
         *
         * where (`d_x`, `d_z`) are Jacobian coordinates of `D` and `(x, z)`
         * are Jacobian coordinates of our desired point -- except both are on
         * the isomorphic curve that we were using when we called `gej_add_ge_var`.
         * To get back to secp256k1, we must multiply both `z`s by `d_z`, or
         * equivalently divide both `x`s by `d_z^2`. Our equation then becomes
         *
         *    rzr = d_x * z^2 / d_z^2 - x
         *
         * (The left-hand-side, being a ratio of z-coordinates, is unaffected
         * by the isomorphism.)
         *
         * Rearranging to solve for `x`, we have
         *
         *     x = d_x * z^2 / d_z^2 - rzr
         *
         * But what we actually want is the affine coordinate `X = x/z^2`,
         * which will satisfy
         *
         *     X = d_x / d_z^2 - rzr / z^2
         *       = dx_over_dz_squared - rzr * zi2
         */
        secp256k1_fe_mul(&p_ge.x, rzr, &zi2);
        secp256k1_fe_negate(&p_ge.x, &p_ge.x, 1);
        secp256k1_fe_add(&p_ge.x, &dx_over_dz_squared);
        /* y is stored_y/z^3, as we expect */
        secp256k1_fe_mul(&p_ge.y, &p_ge.y, &zi3);
        /* Store */
        secp256k1_ge_to_storage(&pre[i], &p_ge);
    }
}